

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_10::ChElementTetraCorot_10(ChElementTetraCorot_10 *this)

{
  vector<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  *this_00;
  
  this->super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  (this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron =
       (_func_int **)&PTR__ChElementTetrahedron_01180558;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_0117f7d0;
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ChElementCorotational::ChElementCorotational(&this->super_ChElementCorotational);
  this_00 = &this->MatrB;
  (this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron = (_func_int **)0x1180588;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0x1180690;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0x1180750;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x11807e0;
  this->Volume = 0.0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->MatrB).
  super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MatrB).
  super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MatrB).
  super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->MatrB).
  super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MatrB).
  super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MatrB).
  super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_data = (double *)0x0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_rows = 0;
  (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
  .m_cols = 0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->nodes,10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
  ::resize(this_00,4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&((this_00->
               super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,6,0x1e);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this_00->
              super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,6,0x1e);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this_00->
              super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,6,0x1e);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this_00->
              super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,6,0x1e);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->StiffnessMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,0x1e,0x1e);
  return;
}

Assistant:

ChElementTetraCorot_10::ChElementTetraCorot_10() : Volume(0) {
    nodes.resize(10);
    MatrB.resize(4);  // standard: 4 integration points
    MatrB[0].setZero(6, 30);
    MatrB[1].setZero(6, 30);
    MatrB[2].setZero(6, 30);
    MatrB[3].setZero(6, 30);
    this->StiffnessMatrix.setZero(30, 30);
}